

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# audio_converter.cc
# Opt level: O3

unique_ptr<webrtc::AudioConverter,_std::default_delete<webrtc::AudioConverter>_> __thiscall
webrtc::AudioConverter::Create
          (AudioConverter *this,size_t src_channels,size_t src_frames,size_t dst_channels,
          size_t dst_frames)

{
  AudioConverter *pAVar1;
  undefined **ppuVar2;
  ResampleConverter *pRVar3;
  CompositionConverter *pCVar4;
  pointer *__ptr;
  vector<std::unique_ptr<webrtc::AudioConverter,_std::default_delete<webrtc::AudioConverter>_>,_std::allocator<std::unique_ptr<webrtc::AudioConverter,_std::default_delete<webrtc::AudioConverter>_>_>_>
  *this_00;
  vector<std::unique_ptr<webrtc::AudioConverter,_std::default_delete<webrtc::AudioConverter>_>,_std::allocator<std::unique_ptr<webrtc::AudioConverter,_std::default_delete<webrtc::AudioConverter>_>_>_>
  converters;
  _Head_base<0UL,_webrtc::AudioConverter_*,_false> local_90;
  vector<std::unique_ptr<webrtc::AudioConverter,_std::default_delete<webrtc::AudioConverter>_>,_std::allocator<std::unique_ptr<webrtc::AudioConverter,_std::default_delete<webrtc::AudioConverter>_>_>_>
  local_88;
  vector<std::unique_ptr<webrtc::AudioConverter,_std::default_delete<webrtc::AudioConverter>_>,_std::allocator<std::unique_ptr<webrtc::AudioConverter,_std::default_delete<webrtc::AudioConverter>_>_>_>
  local_68;
  vector<std::unique_ptr<webrtc::AudioConverter,_std::default_delete<webrtc::AudioConverter>_>,_std::allocator<std::unique_ptr<webrtc::AudioConverter,_std::default_delete<webrtc::AudioConverter>_>_>_>
  local_48;
  
  if (dst_channels < src_channels) {
    if (src_frames != dst_frames) {
      local_88.
      super__Vector_base<std::unique_ptr<webrtc::AudioConverter,_std::default_delete<webrtc::AudioConverter>_>,_std::allocator<std::unique_ptr<webrtc::AudioConverter,_std::default_delete<webrtc::AudioConverter>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_88.
      super__Vector_base<std::unique_ptr<webrtc::AudioConverter,_std::default_delete<webrtc::AudioConverter>_>,_std::allocator<std::unique_ptr<webrtc::AudioConverter,_std::default_delete<webrtc::AudioConverter>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_88.
      super__Vector_base<std::unique_ptr<webrtc::AudioConverter,_std::default_delete<webrtc::AudioConverter>_>,_std::allocator<std::unique_ptr<webrtc::AudioConverter,_std::default_delete<webrtc::AudioConverter>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      pAVar1 = (AudioConverter *)operator_new(0x28);
      AudioConverter(pAVar1,src_channels,src_frames,dst_channels,src_frames);
      pAVar1->_vptr_AudioConverter = (_func_int **)&PTR__AudioConverter_001d0a90;
      local_90._M_head_impl = pAVar1;
      std::
      vector<std::unique_ptr<webrtc::AudioConverter,std::default_delete<webrtc::AudioConverter>>,std::allocator<std::unique_ptr<webrtc::AudioConverter,std::default_delete<webrtc::AudioConverter>>>>
      ::
      emplace_back<std::unique_ptr<webrtc::AudioConverter,std::default_delete<webrtc::AudioConverter>>>
                ((vector<std::unique_ptr<webrtc::AudioConverter,std::default_delete<webrtc::AudioConverter>>,std::allocator<std::unique_ptr<webrtc::AudioConverter,std::default_delete<webrtc::AudioConverter>>>>
                  *)&local_88,
                 (unique_ptr<webrtc::AudioConverter,_std::default_delete<webrtc::AudioConverter>_> *
                 )&local_90);
      if (local_90._M_head_impl != (AudioConverter *)0x0) {
        (*(local_90._M_head_impl)->_vptr_AudioConverter[1])();
      }
      pRVar3 = (ResampleConverter *)operator_new(0x40);
      ResampleConverter::ResampleConverter(pRVar3,dst_channels,src_frames,dst_channels,dst_frames);
      local_90._M_head_impl = (AudioConverter *)pRVar3;
      std::
      vector<std::unique_ptr<webrtc::AudioConverter,std::default_delete<webrtc::AudioConverter>>,std::allocator<std::unique_ptr<webrtc::AudioConverter,std::default_delete<webrtc::AudioConverter>>>>
      ::
      emplace_back<std::unique_ptr<webrtc::AudioConverter,std::default_delete<webrtc::AudioConverter>>>
                ((vector<std::unique_ptr<webrtc::AudioConverter,std::default_delete<webrtc::AudioConverter>>,std::allocator<std::unique_ptr<webrtc::AudioConverter,std::default_delete<webrtc::AudioConverter>>>>
                  *)&local_88,
                 (unique_ptr<webrtc::AudioConverter,_std::default_delete<webrtc::AudioConverter>_> *
                 )&local_90);
      if ((ResampleConverter *)local_90._M_head_impl != (ResampleConverter *)0x0) {
        (*((AudioConverter *)&(local_90._M_head_impl)->_vptr_AudioConverter)->_vptr_AudioConverter
          [1])();
      }
      pCVar4 = (CompositionConverter *)operator_new(0x58);
      local_48.
      super__Vector_base<std::unique_ptr<webrtc::AudioConverter,_std::default_delete<webrtc::AudioConverter>_>,_std::allocator<std::unique_ptr<webrtc::AudioConverter,_std::default_delete<webrtc::AudioConverter>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start =
           local_88.
           super__Vector_base<std::unique_ptr<webrtc::AudioConverter,_std::default_delete<webrtc::AudioConverter>_>,_std::allocator<std::unique_ptr<webrtc::AudioConverter,_std::default_delete<webrtc::AudioConverter>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
      local_48.
      super__Vector_base<std::unique_ptr<webrtc::AudioConverter,_std::default_delete<webrtc::AudioConverter>_>,_std::allocator<std::unique_ptr<webrtc::AudioConverter,_std::default_delete<webrtc::AudioConverter>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish =
           local_88.
           super__Vector_base<std::unique_ptr<webrtc::AudioConverter,_std::default_delete<webrtc::AudioConverter>_>,_std::allocator<std::unique_ptr<webrtc::AudioConverter,_std::default_delete<webrtc::AudioConverter>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      local_48.
      super__Vector_base<std::unique_ptr<webrtc::AudioConverter,_std::default_delete<webrtc::AudioConverter>_>,_std::allocator<std::unique_ptr<webrtc::AudioConverter,_std::default_delete<webrtc::AudioConverter>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage =
           local_88.
           super__Vector_base<std::unique_ptr<webrtc::AudioConverter,_std::default_delete<webrtc::AudioConverter>_>,_std::allocator<std::unique_ptr<webrtc::AudioConverter,_std::default_delete<webrtc::AudioConverter>_>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage;
      local_88.
      super__Vector_base<std::unique_ptr<webrtc::AudioConverter,_std::default_delete<webrtc::AudioConverter>_>,_std::allocator<std::unique_ptr<webrtc::AudioConverter,_std::default_delete<webrtc::AudioConverter>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_88.
      super__Vector_base<std::unique_ptr<webrtc::AudioConverter,_std::default_delete<webrtc::AudioConverter>_>,_std::allocator<std::unique_ptr<webrtc::AudioConverter,_std::default_delete<webrtc::AudioConverter>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_88.
      super__Vector_base<std::unique_ptr<webrtc::AudioConverter,_std::default_delete<webrtc::AudioConverter>_>,_std::allocator<std::unique_ptr<webrtc::AudioConverter,_std::default_delete<webrtc::AudioConverter>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      CompositionConverter::CompositionConverter(pCVar4,&local_48);
      this->_vptr_AudioConverter = (_func_int **)pCVar4;
      this_00 = &local_48;
LAB_0013fa0d:
      std::
      vector<std::unique_ptr<webrtc::AudioConverter,_std::default_delete<webrtc::AudioConverter>_>,_std::allocator<std::unique_ptr<webrtc::AudioConverter,_std::default_delete<webrtc::AudioConverter>_>_>_>
      ::~vector(this_00);
      std::
      vector<std::unique_ptr<webrtc::AudioConverter,_std::default_delete<webrtc::AudioConverter>_>,_std::allocator<std::unique_ptr<webrtc::AudioConverter,_std::default_delete<webrtc::AudioConverter>_>_>_>
      ::~vector(&local_88);
      return (__uniq_ptr_data<webrtc::AudioConverter,_std::default_delete<webrtc::AudioConverter>,_true,_true>
              )(__uniq_ptr_data<webrtc::AudioConverter,_std::default_delete<webrtc::AudioConverter>,_true,_true>
                )this;
    }
    pAVar1 = (AudioConverter *)operator_new(0x28);
    AudioConverter(pAVar1,src_channels,src_frames,dst_channels,src_frames);
    ppuVar2 = &PTR__AudioConverter_001d0a90;
  }
  else if (src_channels < dst_channels) {
    if (src_frames != dst_frames) {
      local_88.
      super__Vector_base<std::unique_ptr<webrtc::AudioConverter,_std::default_delete<webrtc::AudioConverter>_>,_std::allocator<std::unique_ptr<webrtc::AudioConverter,_std::default_delete<webrtc::AudioConverter>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_88.
      super__Vector_base<std::unique_ptr<webrtc::AudioConverter,_std::default_delete<webrtc::AudioConverter>_>,_std::allocator<std::unique_ptr<webrtc::AudioConverter,_std::default_delete<webrtc::AudioConverter>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_88.
      super__Vector_base<std::unique_ptr<webrtc::AudioConverter,_std::default_delete<webrtc::AudioConverter>_>,_std::allocator<std::unique_ptr<webrtc::AudioConverter,_std::default_delete<webrtc::AudioConverter>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      pRVar3 = (ResampleConverter *)operator_new(0x40);
      ResampleConverter::ResampleConverter(pRVar3,src_channels,src_frames,src_channels,dst_frames);
      local_90._M_head_impl = (AudioConverter *)pRVar3;
      std::
      vector<std::unique_ptr<webrtc::AudioConverter,std::default_delete<webrtc::AudioConverter>>,std::allocator<std::unique_ptr<webrtc::AudioConverter,std::default_delete<webrtc::AudioConverter>>>>
      ::
      emplace_back<std::unique_ptr<webrtc::AudioConverter,std::default_delete<webrtc::AudioConverter>>>
                ((vector<std::unique_ptr<webrtc::AudioConverter,std::default_delete<webrtc::AudioConverter>>,std::allocator<std::unique_ptr<webrtc::AudioConverter,std::default_delete<webrtc::AudioConverter>>>>
                  *)&local_88,
                 (unique_ptr<webrtc::AudioConverter,_std::default_delete<webrtc::AudioConverter>_> *
                 )&local_90);
      if ((ResampleConverter *)local_90._M_head_impl != (ResampleConverter *)0x0) {
        (*((AudioConverter *)&(local_90._M_head_impl)->_vptr_AudioConverter)->_vptr_AudioConverter
          [1])();
      }
      pRVar3 = (ResampleConverter *)operator_new(0x28);
      AudioConverter((AudioConverter *)pRVar3,src_channels,dst_frames,dst_channels,dst_frames);
      (pRVar3->super_AudioConverter)._vptr_AudioConverter =
           (_func_int **)&PTR__AudioConverter_001d0b50;
      local_90._M_head_impl = (AudioConverter *)pRVar3;
      std::
      vector<std::unique_ptr<webrtc::AudioConverter,std::default_delete<webrtc::AudioConverter>>,std::allocator<std::unique_ptr<webrtc::AudioConverter,std::default_delete<webrtc::AudioConverter>>>>
      ::
      emplace_back<std::unique_ptr<webrtc::AudioConverter,std::default_delete<webrtc::AudioConverter>>>
                ((vector<std::unique_ptr<webrtc::AudioConverter,std::default_delete<webrtc::AudioConverter>>,std::allocator<std::unique_ptr<webrtc::AudioConverter,std::default_delete<webrtc::AudioConverter>>>>
                  *)&local_88,
                 (unique_ptr<webrtc::AudioConverter,_std::default_delete<webrtc::AudioConverter>_> *
                 )&local_90);
      if ((ResampleConverter *)local_90._M_head_impl != (ResampleConverter *)0x0) {
        (*((AudioConverter *)&(local_90._M_head_impl)->_vptr_AudioConverter)->_vptr_AudioConverter
          [1])();
      }
      pCVar4 = (CompositionConverter *)operator_new(0x58);
      local_68.
      super__Vector_base<std::unique_ptr<webrtc::AudioConverter,_std::default_delete<webrtc::AudioConverter>_>,_std::allocator<std::unique_ptr<webrtc::AudioConverter,_std::default_delete<webrtc::AudioConverter>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start =
           local_88.
           super__Vector_base<std::unique_ptr<webrtc::AudioConverter,_std::default_delete<webrtc::AudioConverter>_>,_std::allocator<std::unique_ptr<webrtc::AudioConverter,_std::default_delete<webrtc::AudioConverter>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
      local_68.
      super__Vector_base<std::unique_ptr<webrtc::AudioConverter,_std::default_delete<webrtc::AudioConverter>_>,_std::allocator<std::unique_ptr<webrtc::AudioConverter,_std::default_delete<webrtc::AudioConverter>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish =
           local_88.
           super__Vector_base<std::unique_ptr<webrtc::AudioConverter,_std::default_delete<webrtc::AudioConverter>_>,_std::allocator<std::unique_ptr<webrtc::AudioConverter,_std::default_delete<webrtc::AudioConverter>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      local_68.
      super__Vector_base<std::unique_ptr<webrtc::AudioConverter,_std::default_delete<webrtc::AudioConverter>_>,_std::allocator<std::unique_ptr<webrtc::AudioConverter,_std::default_delete<webrtc::AudioConverter>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage =
           local_88.
           super__Vector_base<std::unique_ptr<webrtc::AudioConverter,_std::default_delete<webrtc::AudioConverter>_>,_std::allocator<std::unique_ptr<webrtc::AudioConverter,_std::default_delete<webrtc::AudioConverter>_>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage;
      local_88.
      super__Vector_base<std::unique_ptr<webrtc::AudioConverter,_std::default_delete<webrtc::AudioConverter>_>,_std::allocator<std::unique_ptr<webrtc::AudioConverter,_std::default_delete<webrtc::AudioConverter>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_88.
      super__Vector_base<std::unique_ptr<webrtc::AudioConverter,_std::default_delete<webrtc::AudioConverter>_>,_std::allocator<std::unique_ptr<webrtc::AudioConverter,_std::default_delete<webrtc::AudioConverter>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_88.
      super__Vector_base<std::unique_ptr<webrtc::AudioConverter,_std::default_delete<webrtc::AudioConverter>_>,_std::allocator<std::unique_ptr<webrtc::AudioConverter,_std::default_delete<webrtc::AudioConverter>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      CompositionConverter::CompositionConverter(pCVar4,&local_68);
      this->_vptr_AudioConverter = (_func_int **)pCVar4;
      this_00 = &local_68;
      goto LAB_0013fa0d;
    }
    pAVar1 = (AudioConverter *)operator_new(0x28);
    AudioConverter(pAVar1,src_channels,src_frames,dst_channels,src_frames);
    ppuVar2 = &PTR__AudioConverter_001d0b50;
  }
  else {
    if (src_frames != dst_frames) {
      pRVar3 = (ResampleConverter *)operator_new(0x40);
      ResampleConverter::ResampleConverter(pRVar3,src_channels,src_frames,dst_channels,dst_frames);
      this->_vptr_AudioConverter = (_func_int **)pRVar3;
      return (__uniq_ptr_data<webrtc::AudioConverter,_std::default_delete<webrtc::AudioConverter>,_true,_true>
              )(__uniq_ptr_data<webrtc::AudioConverter,_std::default_delete<webrtc::AudioConverter>,_true,_true>
                )this;
    }
    pAVar1 = (AudioConverter *)operator_new(0x28);
    AudioConverter(pAVar1,src_channels,src_frames,dst_channels,src_frames);
    ppuVar2 = &PTR__AudioConverter_001d0b90;
  }
  pAVar1->_vptr_AudioConverter = (_func_int **)ppuVar2;
  this->_vptr_AudioConverter = (_func_int **)pAVar1;
  return (__uniq_ptr_data<webrtc::AudioConverter,_std::default_delete<webrtc::AudioConverter>,_true,_true>
          )(__uniq_ptr_data<webrtc::AudioConverter,_std::default_delete<webrtc::AudioConverter>,_true,_true>
            )this;
}

Assistant:

std::unique_ptr<AudioConverter> AudioConverter::Create(size_t src_channels,
                                                       size_t src_frames,
                                                       size_t dst_channels,
                                                       size_t dst_frames) {
  std::unique_ptr<AudioConverter> sp;
  if (src_channels > dst_channels) {
    if (src_frames != dst_frames) {
      std::vector<std::unique_ptr<AudioConverter>> converters;
      converters.push_back(std::unique_ptr<AudioConverter>(new DownmixConverter(
          src_channels, src_frames, dst_channels, src_frames)));
      converters.push_back(
          std::unique_ptr<AudioConverter>(new ResampleConverter(
              dst_channels, src_frames, dst_channels, dst_frames)));
      sp.reset(new CompositionConverter(std::move(converters)));
    } else {
      sp.reset(new DownmixConverter(src_channels, src_frames, dst_channels,
                                    dst_frames));
    }
  } else if (src_channels < dst_channels) {
    if (src_frames != dst_frames) {
      std::vector<std::unique_ptr<AudioConverter>> converters;
      converters.push_back(
          std::unique_ptr<AudioConverter>(new ResampleConverter(
              src_channels, src_frames, src_channels, dst_frames)));
      converters.push_back(std::unique_ptr<AudioConverter>(new UpmixConverter(
          src_channels, dst_frames, dst_channels, dst_frames)));
      sp.reset(new CompositionConverter(std::move(converters)));
    } else {
      sp.reset(new UpmixConverter(src_channels, src_frames, dst_channels,
                                  dst_frames));
    }
  } else if (src_frames != dst_frames) {
    sp.reset(new ResampleConverter(src_channels, src_frames, dst_channels,
                                   dst_frames));
  } else {
    sp.reset(new CopyConverter(src_channels, src_frames, dst_channels,
                               dst_frames));
  }

  return sp;
}